

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_decoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::
json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
::visit_null(json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
             *this,semantic_tag tag,ser_context *param_3,error_code *param_4)

{
  vector<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  *this_00;
  reference pvVar1;
  undefined1 in_SIL;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDI;
  undefined4 in_stack_ffffffffffffffb0;
  structure_type sVar2;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  pvVar1 = std::
           vector<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
           ::back((vector<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                   *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  sVar2 = pvVar1->type_;
  if (sVar2 == root_t) {
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               &stack0xffffffffffffffb8,in_SIL);
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::operator=
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,sVar2),in_RDI);
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               0x1beb2c);
    in_RDI[7].field_0.short_str_.data_[6] = '\x01';
  }
  else if (sVar2 == array_t || sVar2 == object_t) {
    this_00 = *(vector<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                **)&in_RDI[2].field_0;
    *(undefined1 **)&in_RDI[2].field_0 =
         (undefined1 *)
         ((long)&(this_00->
                 super__Vector_base<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1);
    std::
    vector<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
    ::emplace_back<std::__cxx11::string,unsigned_long,jsoncons::null_type,jsoncons::semantic_tag&>
              (this_00,in_stack_ffffffffffffffc8,(unsigned_long *)in_stack_ffffffffffffffc0,
               (null_type *)in_stack_ffffffffffffffb8,
               (semantic_tag *)CONCAT44(in_stack_ffffffffffffffb4,sVar2));
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_null(semantic_tag tag, const ser_context&, std::error_code&) override
    {
        switch (structure_stack_.back().type_)
        {
            case structure_type::object_t:
            case structure_type::array_t:
                item_stack_.emplace_back(std::move(name_), index_++, null_type(), tag);
                break;
            case structure_type::root_t:
                result_ = Json(null_type(), tag);
                is_valid_ = true;
                JSONCONS_VISITOR_RETURN;
        }
        JSONCONS_VISITOR_RETURN;
    }